

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

void __thiscall
brynet::net::TcpService::postSessionAsyncProc
          (TcpService *this,SESSION_TYPE id,function<void_(brynet::net::DataSocket_*)> *callback)

{
  bool bVar1;
  element_type *this_00;
  __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  anon_class_72_4_99c41505 local_100;
  USER_PROC local_b8;
  undefined1 local_98 [8];
  type ioLoopDataCapture;
  shared_ptr<const_brynet::net::TcpService> shared_this;
  type callbackCapture;
  PTR *eventLoop;
  undefined1 local_38 [8];
  shared_ptr<brynet::net::IOLoopData> ioLoopData;
  SessionId sid;
  function<void_(brynet::net::DataSocket_*)> *callback_local;
  SESSION_TYPE id_local;
  TcpService *this_local;
  
  ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)id;
  getIOLoopDataBySocketID((TcpService *)local_38,(SESSION_TYPE)this);
  bVar1 = std::operator==((shared_ptr<brynet::net::IOLoopData> *)local_38,(nullptr_t)0x0);
  if (!bVar1) {
    this_00 = std::
              __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_38);
    this_01 = (__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)IOLoopData::getEventLoop(this_00);
    std::function<void_(brynet::net::DataSocket_*)>::function
              ((function<void_(brynet::net::DataSocket_*)> *)
               &shared_this.
                super___shared_ptr<const_brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,callback);
    std::enable_shared_from_this<brynet::net::TcpService>::shared_from_this
              ((enable_shared_from_this<brynet::net::TcpService> *)
               &ioLoopDataCapture.
                super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::shared_ptr<brynet::net::IOLoopData>::shared_ptr
              ((shared_ptr<brynet::net::IOLoopData> *)local_98,
               (shared_ptr<brynet::net::IOLoopData> *)local_38);
    this_02 = std::
              __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_01);
    std::function<void_(brynet::net::DataSocket_*)>::function
              (&local_100.callbackCapture,
               (function<void_(brynet::net::DataSocket_*)> *)
               &shared_this.
                super___shared_ptr<const_brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_100.sid.data =
         (anon_struct_8_3_45c75882_for_data)
         ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    std::shared_ptr<const_brynet::net::TcpService>::shared_ptr
              (&local_100.shared_this,
               (shared_ptr<const_brynet::net::TcpService> *)
               &ioLoopDataCapture.
                super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::shared_ptr<brynet::net::IOLoopData>::shared_ptr
              (&local_100.ioLoopDataCapture,(shared_ptr<brynet::net::IOLoopData> *)local_98);
    std::function<void()>::
    function<brynet::net::TcpService::postSessionAsyncProc(long,std::function<void(brynet::net::DataSocket*)>)const::__0,void>
              ((function<void()> *)&local_b8,&local_100);
    EventLoop::pushAsyncProc(this_02,&local_b8);
    std::function<void_()>::~function(&local_b8);
    postSessionAsyncProc(long,std::function<void(brynet::net::DataSocket*)>)::~__0
              ((postSessionAsyncProc_long_std__function<void(brynet::net::DataSocket*)>_ *)
               &local_100);
    std::shared_ptr<brynet::net::IOLoopData>::~shared_ptr
              ((shared_ptr<brynet::net::IOLoopData> *)local_98);
    std::shared_ptr<const_brynet::net::TcpService>::~shared_ptr
              ((shared_ptr<const_brynet::net::TcpService> *)
               &ioLoopDataCapture.
                super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::function<void_(brynet::net::DataSocket_*)>::~function
              ((function<void_(brynet::net::DataSocket_*)> *)
               &shared_this.
                super___shared_ptr<const_brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::shared_ptr<brynet::net::IOLoopData>::~shared_ptr
            ((shared_ptr<brynet::net::IOLoopData> *)local_38);
  return;
}

Assistant:

void TcpService::postSessionAsyncProc(SESSION_TYPE id, 
    std::function<void(DataSocket::PTR)> callback) const
{
    union  SessionId sid;
    sid.id = id;
    auto ioLoopData = getIOLoopDataBySocketID(id);
    if (ioLoopData == nullptr)
    {
        return;
    }

    const auto& eventLoop = ioLoopData->getEventLoop();
    auto callbackCapture = std::move(callback);
    auto shared_this = shared_from_this();
    auto ioLoopDataCapture = std::move(ioLoopData);
    eventLoop->pushAsyncProc([callbackCapture, 
        sid, 
        shared_this, 
        ioLoopDataCapture](){
        DataSocket::PTR tmp = nullptr;
        if (callbackCapture != nullptr &&
            ioLoopDataCapture->getDataSockets().get(sid.data.index, tmp) &&
            tmp != nullptr)
        {
            const auto ud = brynet::net::cast<SESSION_TYPE>(tmp->getUD());
            if (ud != nullptr && *ud == sid.id)
            {
                callbackCapture(tmp);
            }
        }
    });
}